

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

pointer __thiscall
google::
dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
::alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::realloc_or_die
          (alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_> *this,
          pointer ptr,size_type n)

{
  pointer ppVar1;
  
  ppVar1 = (pointer)realloc(ptr,n * 8);
  if (ppVar1 != (pointer)0x0) {
    return ppVar1;
  }
  fprintf(_stderr,"sparsehash: FATAL ERROR: failed to reallocate %lu elements for ptr %p",n,ptr);
  exit(1);
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }